

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O0

bool __thiscall FpgaIO::ReadKSZ8851Reg(FpgaIO *this,uint8_t addr,uint16_t *rdata)

{
  bool bVar1;
  uint32_t uVar2;
  ostream *this_00;
  uint local_30;
  uint local_2c;
  quadlet_t read_data;
  quadlet_t write_data;
  uint16_t *rdata_local;
  FpgaIO *pFStack_18;
  uint8_t addr_local;
  FpgaIO *this_local;
  
  _read_data = rdata;
  rdata_local._7_1_ = addr;
  pFStack_18 = this;
  uVar2 = BoardIO::GetFirmwareVersion(&this->super_BoardIO);
  if (uVar2 < 5) {
    this_local._7_1_ = false;
  }
  else {
    local_2c = (uint)rdata_local._7_1_ << 0x10 | 0x1000000 | (uint)*_read_data;
    bVar1 = WriteEthernetControl(this,local_2c);
    if (bVar1) {
      bVar1 = ReadEthernetStatus(this,&local_30);
      if (bVar1) {
        if ((local_30 & 0x80000000) == 0) {
          this_local._7_1_ = false;
        }
        else if ((local_30 & 0x40000000) == 0) {
          *_read_data = (ushort)local_30;
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_00 = std::operator<<((ostream *)&std::cout,"WriteQuadlet failed");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool FpgaIO::ReadKSZ8851Reg(uint8_t addr, uint16_t &rdata)
{
    if (GetFirmwareVersion() < 5) return false;
    quadlet_t write_data = ETH_CTRL_WB_V2 | (static_cast<quadlet_t>(addr) << 16) | rdata;
    if (!WriteEthernetControl(write_data)) {
        std::cout << "WriteQuadlet failed" << std::endl;
        return false;
    }
    quadlet_t read_data;
    if (!ReadEthernetStatus(read_data))
        return false;
    // Check if Ethernet is present
    if (!(read_data&ETH_STAT_PRESENT_V2)) return false;
    // Check if last command had an error
    if (read_data&ETH_STAT_REQ_ERR_V2) return false;
    rdata = static_cast<uint16_t>(read_data);
    return true;
}